

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O3

int Catch(Situation *situation,Movement *move)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  int player;
  uint uVar14;
  
  uVar10 = (uint)move->to;
  uVar6 = (uint)situation->current_board[uVar10] + situation->current_player * -0x10;
  uVar13 = 0;
  if (uVar6 < 0x1b) {
    player = 1 - situation->current_player;
    uVar14 = player * 0x10 + 0x10;
    uVar13 = 0;
    if ((0x600000U >> (uVar6 & 0x1f) & 1) == 0) {
      uVar12 = uVar10 & 0xf;
      bVar1 = move->to >> 4;
      if ((0x1800000U >> (uVar6 & 0x1f) & 1) != 0) {
        if (uVar12 != (move->from & 0xf)) {
          uVar3 = situation->bit_col[uVar12];
          lVar9 = 0;
          bVar5 = true;
LAB_0010938b:
          do {
            bVar2 = *(byte *)(lVar9 + (long)(int)(bVar1 - 3) * 0x2000 + 0x311d52 + (ulong)uVar3 * 8)
            ;
            if (bVar1 != bVar2) {
              uVar6 = (uint)bVar2 * 0x10;
              uVar10 = uVar6 + uVar12;
              uVar13 = (uint)situation->current_board[uVar10];
              uVar8 = (uint)situation->current_board[uVar10];
              if ((uVar14 & uVar8) != 0) {
                uVar7 = uVar8 - uVar14;
                if (uVar8 == uVar14) {
                  return uVar14;
                }
                if ((int)uVar7 < 8) {
                  if (uVar7 == 7 || (int)uVar7 < 5) goto LAB_00109401;
                }
                else if ((10 < uVar7) && ((uVar6 & 0x80) != player * 0x80)) goto LAB_00109401;
                bVar4 = IfProtected(player,uVar10,situation,0);
                lVar9 = 1;
                bVar2 = bVar4 & bVar5;
                bVar5 = false;
                if (bVar2 == 0) goto LAB_001094ce;
                goto LAB_0010938b;
              }
            }
LAB_00109401:
            lVar9 = 1;
            bVar4 = !bVar5;
            bVar5 = false;
            if (bVar4) {
              return 0;
            }
          } while( true );
        }
        uVar3 = situation->bit_row[bVar1];
        lVar9 = 0;
        bVar5 = true;
LAB_0010921f:
        do {
          bVar1 = *(byte *)(lVar9 + (long)(int)(uVar12 - 3) * 0x1000 + 0x308d52 + (ulong)uVar3 * 8);
          if (uVar12 != bVar1) {
            uVar11 = (ulong)bVar1 | (ulong)(uVar10 & 0xfffffff0);
            uVar13 = (uint)situation->current_board[uVar11];
            uVar6 = (uint)situation->current_board[uVar11];
            if ((uVar14 & uVar6) != 0) {
              uVar8 = uVar6 - uVar14;
              if (uVar6 == uVar14) {
                return uVar14;
              }
              uVar6 = (uint)uVar11;
              if ((int)uVar8 < 8) {
                if (uVar8 == 7 || (int)uVar8 < 5) goto LAB_00109291;
              }
              else if ((10 < uVar8) && ((uVar6 & 0xffffff80) != player * 0x80)) goto LAB_00109291;
              bVar4 = IfProtected(player,uVar6,situation,0);
              lVar9 = 1;
              bVar1 = bVar4 & bVar5;
              bVar5 = false;
              if (bVar1 == 0) goto LAB_001094ce;
              goto LAB_0010921f;
            }
          }
LAB_00109291:
          lVar9 = 1;
          bVar4 = !bVar5;
          bVar5 = false;
          if (bVar4) {
            return 0;
          }
        } while( true );
      }
      if ((0x6000000U >> (uVar6 & 0x1f) & 1) != 0) {
        if (uVar12 == (move->from & 0xf)) {
          uVar3 = situation->bit_row[bVar1];
          lVar9 = 0;
          bVar5 = true;
          do {
            while (bVar1 = *(byte *)(lVar9 + (long)(int)(uVar12 - 3) * 0x1000 + 0x308d54 +
                                             (ulong)uVar3 * 8), uVar12 == bVar1) {
LAB_001091c4:
              lVar9 = 1;
              bVar4 = !bVar5;
              bVar5 = false;
              if (bVar4) {
                return 0;
              }
            }
            uVar11 = (ulong)bVar1 | (ulong)(uVar10 & 0xfffffff0);
            bVar1 = situation->current_board[uVar11];
            uVar13 = (uint)bVar1;
            if ((uVar14 & bVar1) == 0) goto LAB_001091c4;
            uVar6 = bVar1 - uVar14;
            if (uVar6 == 0) {
              return uVar14;
            }
            uVar8 = (uint)uVar11;
            if ((int)uVar6 < 9) {
              if (1 < uVar6 - 5) {
                return uVar13;
              }
            }
            else if ((uVar6 < 0xb) || ((uVar8 & 0xffffff80) != player * 0x80)) goto LAB_001091c4;
            bVar4 = IfProtected(player,uVar8,situation,0);
            lVar9 = 1;
            bVar1 = bVar4 & bVar5;
            bVar5 = false;
          } while (bVar1 != 0);
        }
        else {
          uVar3 = situation->bit_col[uVar12];
          lVar9 = 0;
          bVar5 = true;
          do {
            while (bVar2 = *(byte *)(lVar9 + (long)(int)(bVar1 - 3) * 0x2000 + 0x311d54 +
                                             (ulong)uVar3 * 8), bVar1 == bVar2) {
LAB_001094b3:
              lVar9 = 1;
              bVar4 = !bVar5;
              bVar5 = false;
              if (bVar4) {
                return 0;
              }
            }
            uVar6 = (uint)bVar2 * 0x10;
            uVar10 = uVar6 + uVar12;
            bVar2 = situation->current_board[uVar10];
            uVar13 = (uint)bVar2;
            if ((uVar14 & bVar2) == 0) goto LAB_001094b3;
            uVar8 = bVar2 - uVar14;
            if (uVar8 == 0) {
              return uVar14;
            }
            if ((int)uVar8 < 9) {
              if (1 < uVar8 - 5) {
                return uVar13;
              }
            }
            else if ((uVar8 < 0xb) || ((uVar6 & 0x80) != player * 0x80)) goto LAB_001094b3;
            bVar4 = IfProtected(player,uVar10,situation,0);
            lVar9 = 1;
            bVar2 = bVar4 & bVar5;
            bVar5 = false;
          } while (bVar2 != 0);
        }
LAB_001094ce:
        if (bVar4 != false) {
          uVar13 = 0;
        }
      }
    }
    else {
      uVar6 = HORSE_CAN_GET[uVar10][0];
      if (uVar6 != 0) {
        lVar9 = (ulong)(uVar10 * 8) * 5;
        do {
          if (situation->current_board[*(int *)((long)HORSE_LEG[0] + lVar9)] == '\0') {
            bVar1 = situation->current_board[(int)uVar6];
            uVar13 = (uint)bVar1;
            if ((uVar14 & uVar13) != 0) {
              uVar10 = uVar13 - uVar14;
              if (uVar13 == uVar14) {
                return uVar14;
              }
              if ((int)uVar10 < 9) {
                if (6 < (int)uVar10) {
                  return (uint)bVar1;
                }
              }
              else if (((uVar10 < 0xb) || ((uVar6 & 0x80) == player * 0x80)) &&
                      (bVar5 = IfProtected(player,uVar6,situation,0), !bVar5)) {
                return (uint)bVar1;
              }
            }
          }
          uVar6 = *(uint *)((long)HORSE_CAN_GET[0] + lVar9 + 4);
          lVar9 = lVar9 + 4;
        } while (uVar6 != 0);
        uVar13 = 0;
      }
    }
  }
  return uVar13;
}

Assistant:

int Catch(const Situation & situation, const Movement & move){
    int player_flag, opplayer_flag, from, to, from_id, catch_id, counter;
    player_flag = GetPlayerFlag(situation.current_player);
    opplayer_flag = GetPlayerFlag(OpponentPlayer(situation.current_player));
    from = move.to;
    from_id = situation.current_board[from];
    int horse_leg;
    int from_col = GetCol(from), from_row = GetRow(from);

    switch (from_id - player_flag){
    // 马抓子
    case 5:
    case 6:
        counter = 0;
        to = HORSE_CAN_GET[from][counter];
        while(to != 0){
            horse_leg = HORSE_LEG[from][counter];
            catch_id = situation.current_board[to];
            if(situation.current_board[horse_leg] == 0 && (catch_id & opplayer_flag) != 0){
                int catch_id_no = catch_id - opplayer_flag;
                if(catch_id_no == 0) return catch_id;
                if(catch_id_no <= 8){
                    if(catch_id_no >= 7) return catch_id;
                }
                else if(catch_id_no <= 10){
                    if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                }
                else{
                    if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                }
            }
            counter ++;
            to = HORSE_CAN_GET[from][counter];
        }
        break;
    // 车抓子
    case 7:
    case 8:
        // 纵向移动
        if(from_col == GetCol(move.from)){
            for(int i = 0; i < 2; i ++){
                int catch_col = ROOK_CANNON_CAN_GET_ROW[from_col - 3][situation.bit_row[from_row]].rook_capture[i];
                if(catch_col != from_col){
                    to = GetPosition(catch_col, from_row);
                    catch_id = situation.current_board[to];
                    if((catch_id & opplayer_flag) != 0){
                        int catch_id_no = catch_id - opplayer_flag;
                        if(catch_id_no == 0) return catch_id;
                        if(catch_id_no <= 7){
                            if(catch_id_no >= 5 && catch_id_no <= 6){
                                if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                            }
                        }
                        else if(catch_id_no <= 10){
                            if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                        else{
                            if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                    }
                }
            }
        }
        // 横向移动
        else{
            for(int i = 0;i < 2; i ++){
                int catch_row = ROOK_CANNON_CAN_GET_COL[from_row - 3][situation.bit_col[from_col]].rook_capture[i];
                if(catch_row != from_row){
                    to = GetPosition(from_col, catch_row);
                    catch_id = situation.current_board[to];
                    if((catch_id & opplayer_flag) != 0){
                        int catch_id_no = catch_id - opplayer_flag;
                        if(catch_id_no == 0) return catch_id;
                        if(catch_id_no <= 7){
                            if(catch_id_no >= 5 && catch_id_no <= 6){
                                if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                            }
                        }
                        else if(catch_id_no <= 10){
                            if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                        else{
                            if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                    }
                }
            }
        }
        break;
    // 炮抓子
    case 9:
    case 10:
        // 纵向移动
        if(from_col == GetCol(move.from)){
            for(int i = 0; i < 2; i ++){
                int catch_col = ROOK_CANNON_CAN_GET_ROW[from_col - 3][situation.bit_row[from_row]].cannon_capture[i];
                if(catch_col != from_col){
                    to = GetPosition(catch_col, from_row);
                    catch_id = situation.current_board[to];
                    if((catch_id & opplayer_flag) != 0){
                        int catch_id_no = catch_id - opplayer_flag;
                        if(catch_id_no == 0) return catch_id;
                        if(catch_id_no <= 8){
                            if(catch_id_no >= 5 && catch_id_no <= 6){
                                if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                            }
                            else return catch_id;
                        }
                        else if(catch_id_no >= 11){
                            if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                    }
                }
            }
        }
        // 横向移动
        else{
            for(int i = 0;i < 2; i ++){
                int catch_row = ROOK_CANNON_CAN_GET_COL[from_row - 3][situation.bit_col[from_col]].cannon_capture[i];
                if(catch_row != from_row){
                    to = GetPosition(from_col, catch_row);
                    catch_id = situation.current_board[to];
                    if((catch_id & opplayer_flag) != 0){
                        int catch_id_no = catch_id - opplayer_flag;
                        if(catch_id_no == 0) return catch_id;
                        if(catch_id_no <= 8){
                            if(catch_id_no >= 5 && catch_id_no <= 6){
                                if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                            }
                            else return catch_id;
                        }
                        else if(catch_id_no >= 11){
                            if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                    }
                }
            }
        }
        break;
    default:
        break;
    }
    return 0;
}